

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase247::run(TestCase247 *this)

{
  uchar *puVar1;
  uchar *__s;
  uchar *puVar2;
  ArrayPtr<unsigned_char> AVar3;
  Arena arena;
  uchar *local_30;
  uchar *local_28;
  
  Arena::Arena(&arena,0x400);
  puVar1 = Arena::allocate<unsigned_char>(&arena);
  AVar3 = Arena::allocateArray<unsigned_char>(&arena,0x400);
  __s = AVar3.ptr;
  puVar2 = Arena::allocate<unsigned_char>(&arena);
  if ((__s <= puVar1 + 0x200 && puVar1 <= __s) && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x101,ERROR,"\"failed: expected \" \"arr.begin() < &b1 || arr.begin() > &b1 + 512\""
               ,(char (*) [62])"failed: expected arr.begin() < &b1 || arr.begin() > &b1 + 512");
  }
  if ((__s + AVar3.size_ != puVar2) && (_::Debug::minSeverity < 3)) {
    local_30 = puVar2;
    local_28 = __s + AVar3.size_;
    _::Debug::log<char_const(&)[38],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x104,ERROR,"\"failed: expected \" \"(arr.end()) == (&b2)\", arr.end(), &b2",
               (char (*) [38])"failed: expected (arr.end()) == (&b2)",&local_28,&local_30);
  }
  memset(__s,0xbe,AVar3.size_);
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, TooBig) {
  Arena arena(1024);

  byte& b1 = arena.allocate<byte>();

  ArrayPtr<byte> arr = arena.allocateArray<byte>(1024);

  byte& b2 = arena.allocate<byte>();

  // The array should not have been allocated anywhere near that first byte.
  EXPECT_TRUE(arr.begin() < &b1 || arr.begin() > &b1 + 512);

  // The next byte should have been allocated after the array.
  EXPECT_EQ(arr.end(), &b2);

  // Write to the array to make sure it's valid.
  memset(arr.begin(), 0xbe, arr.size());
}